

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generic.cpp
# Opt level: O2

void ac::core::cpu::conv3x3_8to8_generic(Image *src,Image *dst,float *kernels,float *biases)

{
  anon_class_32_5_78cfb1ca aStack_20;
  
  aStack_20.w = src->w;
  aStack_20.h = src->h;
  aStack_20.step = src->pitch / (int)(uint)(byte)src->elementType;
  aStack_20.kernels = kernels;
  aStack_20.biases = biases;
  filter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_src_cpu_Generic_cpp:12:16),_const_ac::core::Image,_ac::core::Image,_true>
            (&aStack_20,src,dst);
  return;
}

Assistant:

void conv3x3_8to8_generic(const Image& src, Image& dst, const float* kernels, const float* biases)
    {
        conv3x3_generic<float, float, 8, 8>(src, dst, kernels, biases);
    }